

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void testing::internal::internal_stream_operator_without_lexical_name_lookup::StreamPrinter::
     PrintValue<wasm::Struct,void,std::ostream&>(Struct *value,ostream *os)

{
  _Vector_base<wasm::Field,_std::allocator<wasm::Field>_> in_stack_ffffffffffffffc8;
  
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
            ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)&stack0xffffffffffffffd0,
             &value->fields);
  wasm::operator<<(os,(Struct)in_stack_ffffffffffffffc8._M_impl.super__Vector_impl_data);
  std::_Vector_base<wasm::Field,_std::allocator<wasm::Field>_>::~_Vector_base
            ((_Vector_base<wasm::Field,_std::allocator<wasm::Field>_> *)&stack0xffffffffffffffd0);
  return;
}

Assistant:

static void PrintValue(const T& value, ::std::ostream* os) {
    // Call streaming operator found by ADL, possibly with implicit conversions
    // of the arguments.
    *os << value;
  }